

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::
fill_internal_output
          (cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,float *input_buffer,long *input_frames_count,float *output_buffer,
          long output_frames_needed)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  cubeb_resampler_speex_one_way<float> *this_00;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  
  this_00 = (this->output_processor)._M_t.
            super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (this->draining == false) {
    uVar1 = (this_00->resampling_in_buffer).length_;
    uVar4 = (ulong)(this_00->super_processor).channels;
    uVar5 = 0;
    fVar6 = (float)((int)output_frames_needed - (int)(uVar1 / uVar4)) * this_00->resampling_ratio -
            (float)(int)((this_00->resampling_out_buffer).length_ / uVar4);
    if (0.0 <= fVar6) {
      fVar6 = ceilf(fVar6);
      uVar5 = (long)fVar6 & 0xffffffff;
    }
    this_00->leftover_samples = (uint32_t)uVar1;
    auto_array<float>::reserve(&this_00->resampling_in_buffer,uVar4 * uVar5 + (uVar1 & 0xffffffff));
    lVar2 = (*this->data_callback)
                      (this->stream,this->user_ptr,(void *)0x0,
                       (this_00->resampling_in_buffer).data_ + this_00->leftover_samples,uVar5);
    if ((lVar2 < (long)uVar5) && (this->draining = true, lVar2 < 0)) {
      return lVar2;
    }
    this_00 = (this->output_processor)._M_t.
              super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
              .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
    (this_00->resampling_in_buffer).length_ =
         lVar2 * (ulong)(this_00->super_processor).channels + (ulong)this_00->leftover_samples;
  }
  sVar3 = cubeb_resampler_speex_one_way<float>::output(this_00,output_buffer,output_frames_needed);
  return sVar3;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_output(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long output_frames_needed)
{
  assert(!input_buffer && (!input_frames_count || *input_frames_count == 0) &&
         output_buffer && output_frames_needed);

  if (!draining) {
    long got = 0;
    T * out_unprocessed = nullptr;
    long output_frames_before_processing = 0;

    /* fill directly the input buffer of the output processor to save a copy */
    output_frames_before_processing =
        output_processor->input_needed_for_output(output_frames_needed);

    out_unprocessed =
        output_processor->input_buffer(output_frames_before_processing);

    got = data_callback(stream, user_ptr, nullptr, out_unprocessed,
                        output_frames_before_processing);

    if (got < output_frames_before_processing) {
      draining = true;

      if (got < 0) {
        return got;
      }
    }

    output_processor->written(got);
  }

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  return output_processor->output(output_buffer, output_frames_needed);
}